

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabUnlock(VTable *pVTab)

{
  sqlite3 *db_00;
  sqlite3_vtab *psVar1;
  sqlite3_vtab *p;
  sqlite3 *db;
  VTable *pVTab_local;
  
  db_00 = pVTab->db;
  pVTab->nRef = pVTab->nRef + -1;
  if (pVTab->nRef == 0) {
    psVar1 = pVTab->pVtab;
    sqlite3VtabModuleUnref(pVTab->db,pVTab->pMod);
    if (psVar1 != (sqlite3_vtab *)0x0) {
      (*psVar1->pModule->xDisconnect)(psVar1);
    }
    sqlite3DbFree(db_00,pVTab);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabUnlock(VTable *pVTab){
  sqlite3 *db = pVTab->db;

  assert( db );
  assert( pVTab->nRef>0 );
  assert( db->eOpenState==SQLITE_STATE_OPEN
       || db->eOpenState==SQLITE_STATE_ZOMBIE );

  pVTab->nRef--;
  if( pVTab->nRef==0 ){
    sqlite3_vtab *p = pVTab->pVtab;
    sqlite3VtabModuleUnref(pVTab->db, pVTab->pMod);
    if( p ){
      p->pModule->xDisconnect(p);
    }
    sqlite3DbFree(db, pVTab);
  }
}